

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O3

void pubkeyExceptionTest(string *hex)

{
  pointer puVar1;
  bool bVar2;
  AssertHelper local_70;
  Pubkey local_68;
  Pubkey local_48;
  ByteData local_28;
  
  cfd::core::Pubkey::Pubkey(&local_48);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Pubkey::Pubkey(&local_68,hex);
    puVar1 = local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((long *)puVar1 != (long *)0x0) {
      operator_delete(puVar1);
      if ((long *)local_68.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_68.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  testing::Message::Message((Message *)&local_68);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
             ,99,
             "Expected: (pubkey = Pubkey(hex)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if ((long *)local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((long *)local_68.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0)) {
      (**(code **)(*(long *)local_68.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ByteData::ByteData(&local_28,hex);
    cfd::core::Pubkey::Pubkey(&local_68,&local_28);
    puVar1 = local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((long *)puVar1 != (long *)0x0) {
      operator_delete(puVar1);
      if ((long *)local_68.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_68.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_68);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
             ,100,
             "Expected: (pubkey = Pubkey(ByteData(hex))) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if ((long *)local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((long *)local_68.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0)) {
      (**(code **)(*(long *)local_68.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((long *)local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_48.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void pubkeyExceptionTest(std::string hex) {
  Pubkey pubkey;
  EXPECT_THROW((pubkey = Pubkey(hex)), CfdException);
  EXPECT_THROW((pubkey = Pubkey(ByteData(hex))), CfdException);
}